

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementScroll.cpp
# Opt level: O0

void __thiscall Rml::ElementScroll::UpdateScrollbar(ElementScroll *this,Orientation orientation)

{
  bool bVar1;
  pointer pWVar2;
  float fVar3;
  float fVar4;
  float local_1c;
  float local_18;
  float traversable_track;
  float bar_position;
  Orientation orientation_local;
  ElementScroll *this_local;
  
  if (orientation == VERTICAL) {
    local_18 = Element::GetScrollTop(this->element);
    local_1c = Element::GetScrollHeight(this->element);
    fVar3 = Element::GetClientHeight(this->element);
    local_1c = local_1c - fVar3;
  }
  else {
    local_18 = Element::GetScrollLeft(this->element);
    local_1c = Element::GetScrollWidth(this->element);
    fVar3 = Element::GetClientWidth(this->element);
    local_1c = local_1c - fVar3;
  }
  if (0.0 < local_1c) {
    local_18 = local_18 / local_1c;
  }
  else {
    local_18 = 0.0;
  }
  bVar1 = ::std::operator!=(&this->scrollbars[orientation].widget,(nullptr_t)0x0);
  if (bVar1) {
    fVar3 = Math::Clamp<float>(local_18,0.0,1.0);
    pWVar2 = ::std::unique_ptr<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>::
             operator->(&this->scrollbars[orientation].widget);
    fVar4 = WidgetScroll::GetBarPosition(pWVar2);
    if ((fVar4 != fVar3) || (NAN(fVar4) || NAN(fVar3))) {
      pWVar2 = ::std::unique_ptr<Rml::WidgetScroll,_std::default_delete<Rml::WidgetScroll>_>::
               operator->(&this->scrollbars[orientation].widget);
      WidgetScroll::SetBarPosition(pWVar2,fVar3);
    }
  }
  return;
}

Assistant:

void ElementScroll::UpdateScrollbar(Orientation orientation)
{
	float bar_position;
	float traversable_track;
	if (orientation == VERTICAL)
	{
		bar_position = element->GetScrollTop();
		traversable_track = element->GetScrollHeight() - element->GetClientHeight();
	}
	else
	{
		bar_position = element->GetScrollLeft();
		traversable_track = element->GetScrollWidth() - element->GetClientWidth();
	}

	if (traversable_track <= 0)
		bar_position = 0;
	else
		bar_position /= traversable_track;

	if (scrollbars[orientation].widget != nullptr)
	{
		bar_position = Math::Clamp(bar_position, 0.0f, 1.0f);

		if (scrollbars[orientation].widget->GetBarPosition() != bar_position)
			scrollbars[orientation].widget->SetBarPosition(bar_position);
	}
}